

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

aom_codec_err_t
av1_get_seq_level_idx(SequenceHeader *seq_params,AV1LevelParams *level_params,int *seq_level_idx)

{
  byte bVar1;
  BITSTREAM_PROFILE profile;
  byte bVar2;
  AV1LevelInfo *level_info;
  byte level_00;
  TARGET_LEVEL_FAIL_ID TVar3;
  int op;
  long lVar4;
  int level;
  uint uVar5;
  
  bVar1 = seq_params->still_picture;
  lVar4 = 0;
  profile = seq_params->profile;
  do {
    if (seq_params->operating_points_cnt_minus_1 < lVar4) {
      return AOM_CODEC_OK;
    }
    seq_level_idx[lVar4] = 0x1f;
    if ((level_params->keep_level_stats >> ((uint)lVar4 & 0x1f) & 1) != 0) {
      bVar2 = seq_params->tier[lVar4];
      level_info = level_params->level_info[lVar4];
      for (uVar5 = 0; uVar5 != 0x1c; uVar5 = uVar5 + 1) {
        level_00 = (byte)uVar5;
        if (((level_00 & 0x1a) != 2) &&
           (((0x1a < level_00 || ((0x7f00c00U >> (uVar5 & 0x1f) & 1) == 0)) && (uVar5 != 0x1b)))) {
          TVar3 = check_level_constraints(level_info,level_00,(uint)bVar2,(uint)bVar1,profile,1);
          if (TVar3 == TARGET_LEVEL_OK) {
            seq_level_idx[lVar4] = uVar5;
            break;
          }
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

aom_codec_err_t av1_get_seq_level_idx(const SequenceHeader *seq_params,
                                      const AV1LevelParams *level_params,
                                      int *seq_level_idx) {
  const int is_still_picture = seq_params->still_picture;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  for (int op = 0; op < seq_params->operating_points_cnt_minus_1 + 1; ++op) {
    seq_level_idx[op] = (int)SEQ_LEVEL_MAX;
    if (!((level_params->keep_level_stats >> op) & 1)) continue;
    const int tier = seq_params->tier[op];
    const AV1LevelInfo *const level_info = level_params->level_info[op];
    assert(level_info != NULL);
    for (int level = 0; level < SEQ_LEVELS; ++level) {
      if (!is_valid_seq_level_idx(level)) continue;
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, level, tier, is_still_picture, profile, 1);
      if (fail_id == TARGET_LEVEL_OK) {
        seq_level_idx[op] = level;
        break;
      }
    }
  }

  return AOM_CODEC_OK;
}